

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readme_examples.c
# Opt level: O1

int supports_full_hd(char *monitor)

{
  bool bVar1;
  cJSON *object;
  cJSON *pcVar2;
  cJSON *pcVar3;
  cJSON *pcVar4;
  int iVar5;
  int iVar6;
  double dVar7;
  
  iVar5 = 0;
  object = cJSON_ParseWithOpts(monitor,(char **)0x0,0);
  if (object == (cJSON *)0x0) {
    if (global_error_0 != 0) {
      supports_full_hd_cold_1();
    }
  }
  else {
    pcVar2 = get_object_item(object,"name",1);
    if (((pcVar2 != (cJSON *)0x0) && ((char)pcVar2->type == '\x10')) &&
       (pcVar2->valuestring != (char *)0x0)) {
      printf("Checking monitor \"%s\"\n");
    }
    pcVar2 = get_object_item(object,"resolutions",1);
    iVar5 = 0;
    if (pcVar2 == (cJSON *)0x0) {
      pcVar2 = (cJSON *)0x0;
    }
    else {
      pcVar2 = pcVar2->child;
    }
    if (pcVar2 != (cJSON *)0x0) {
      iVar5 = 0;
      do {
        pcVar3 = get_object_item(pcVar2,"width",1);
        pcVar4 = get_object_item(pcVar2,"height",1);
        if (pcVar3 == (cJSON *)0x0) {
          iVar6 = 0;
LAB_00106923:
          bVar1 = false;
        }
        else {
          bVar1 = false;
          iVar6 = 0;
          if ((pcVar4 != (cJSON *)0x0 && (char)pcVar3->type == '\b') &&
             (iVar6 = 0, (char)pcVar4->type == '\b')) {
            dVar7 = ABS(pcVar3->valuedouble);
            if (dVar7 <= 1920.0) {
              dVar7 = 1920.0;
            }
            if (ABS(pcVar3->valuedouble + -1920.0) <= dVar7 * 2.220446049250313e-16) {
              dVar7 = ABS(pcVar4->valuedouble);
              if (dVar7 <= 1080.0) {
                dVar7 = 1080.0;
              }
              if (ABS(pcVar4->valuedouble + -1080.0) <= dVar7 * 2.220446049250313e-16) {
                iVar6 = 1;
                goto LAB_00106923;
              }
            }
            bVar1 = true;
            iVar6 = iVar5;
          }
        }
        iVar5 = iVar6;
      } while ((bVar1) && (pcVar2 = pcVar2->next, pcVar2 != (cJSON *)0x0));
    }
  }
  cJSON_Delete(object);
  return iVar5;
}

Assistant:

static int supports_full_hd(const char * const monitor)
{
    const cJSON *resolution = NULL;
    const cJSON *resolutions = NULL;
    const cJSON *name = NULL;
    int status = 0;
    cJSON *monitor_json = cJSON_Parse(monitor);
    if (monitor_json == NULL)
    {
        const char *error_ptr = cJSON_GetErrorPtr();
        if (error_ptr != NULL)
        {
            fprintf(stderr, "Error before: %s\n", error_ptr);
        }
        status = 0;
        goto end;
    }

    name = cJSON_GetObjectItemCaseSensitive(monitor_json, "name");
    if (cJSON_IsString(name) && (name->valuestring != NULL))
    {
        printf("Checking monitor \"%s\"\n", name->valuestring);
    }

    resolutions = cJSON_GetObjectItemCaseSensitive(monitor_json, "resolutions");
    cJSON_ArrayForEach(resolution, resolutions)
    {
        cJSON *width = cJSON_GetObjectItemCaseSensitive(resolution, "width");
        cJSON *height = cJSON_GetObjectItemCaseSensitive(resolution, "height");

        if (!cJSON_IsNumber(width) || !cJSON_IsNumber(height))
        {
            status = 0;
            goto end;
        }

        if (compare_double(width->valuedouble, 1920) && compare_double(height->valuedouble, 1080))
        {
            status = 1;
            goto end;
        }
    }

end:
    cJSON_Delete(monitor_json);
    return status;
}